

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNodeSetClearFromPos(xmlNodeSetPtr set,int pos,int hasNsNodes)

{
  xmlNodePtr ns;
  long lVar1;
  
  if ((set != (xmlNodeSetPtr)0x0) && (pos < set->nodeNr)) {
    if ((hasNsNodes != 0) && (pos < set->nodeNr)) {
      lVar1 = (long)pos;
      do {
        ns = set->nodeTab[lVar1];
        if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
          xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < set->nodeNr);
    }
    set->nodeNr = pos;
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetClearFromPos(xmlNodeSetPtr set, int pos, int hasNsNodes)
{
    if ((set == NULL) || (pos >= set->nodeNr))
	return;
    else if ((hasNsNodes)) {
	int i;
	xmlNodePtr node;

	for (i = pos; i < set->nodeNr; i++) {
	    node = set->nodeTab[i];
	    if ((node != NULL) &&
		(node->type == XML_NAMESPACE_DECL))
		xmlXPathNodeSetFreeNs((xmlNsPtr) node);
	}
    }
    set->nodeNr = pos;
}